

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenCopyMoveCtorAndAssigOpDecls
          (CppGenerator *this,StructDef *struct_def)

{
  bool bVar1;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  if ((0 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) &&
     (local_18 = struct_def, struct_def_local = (StructDef *)this,
     bVar1 = NeedsCopyCtorAssignOp(this,struct_def), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NATIVE_NAME",&local_39);
    Name_abi_cxx11_(&local_90,this,&local_18->super_Definition);
    NativeName(&local_70,&local_90,local_18,&(this->opts_).super_IDLOptions);
    CodeWriter::SetValue(&this->code_,&local_38,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"  {{NATIVE_NAME}}(const {{NATIVE_NAME}} &o);",&local_b1);
    CodeWriter::operator+=(&this->code_,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,
               "  {{NATIVE_NAME}}({{NATIVE_NAME}}&&) FLATBUFFERS_NOEXCEPT = default;",&local_d9);
    CodeWriter::operator+=(&this->code_,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,
               "  {{NATIVE_NAME}} &operator=({{NATIVE_NAME}} o) FLATBUFFERS_NOEXCEPT;",&local_101);
    CodeWriter::operator+=(&this->code_,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
  }
  return;
}

Assistant:

void GenCopyMoveCtorAndAssigOpDecls(const StructDef &struct_def) {
    if (opts_.g_cpp_std < cpp::CPP_STD_11) return;
    if (!NeedsCopyCtorAssignOp(struct_def)) return;
    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));
    code_ += "  {{NATIVE_NAME}}(const {{NATIVE_NAME}} &o);";
    code_ +=
        "  {{NATIVE_NAME}}({{NATIVE_NAME}}&&) FLATBUFFERS_NOEXCEPT = "
        "default;";
    code_ +=
        "  {{NATIVE_NAME}} &operator=({{NATIVE_NAME}} o) FLATBUFFERS_NOEXCEPT;";
  }